

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  char cVar1;
  CURLcode CVar2;
  CURLUcode CVar3;
  Curl_handler *pCVar4;
  int *piVar5;
  size_t sVar6;
  char *pcVar7;
  bool local_149;
  size_t local_148;
  char *pcStack_128;
  CURLcode result_4;
  char *decoded;
  size_t dlen;
  size_t sStack_110;
  _Bool bad;
  size_t n;
  dynbuf qbuf;
  _Bool addamperand;
  size_t querylen;
  char *pcStack_d0;
  CURLcode result_3;
  char *p;
  char out [3];
  byte *pbStack_c0;
  CURLcode result_2;
  uchar *i;
  undefined1 local_b0 [4];
  CURLcode result_1;
  dynbuf enc;
  char *newp;
  char *redired_url;
  char *oldurl;
  CURLUcode uc;
  CURLcode result;
  unsigned_long port;
  char *endp;
  char *tmp;
  char *s;
  size_t plen;
  size_t nalloc;
  _Bool equalsencode;
  _Bool appendquery;
  _Bool leadingslash;
  _Bool urlskipslash;
  _Bool plusencode;
  CURLU *pCStack_38;
  _Bool urlencode;
  char **storep;
  byte *pbStack_28;
  uint flags_local;
  char *part_local;
  CURLU *pCStack_18;
  CURLUPart what_local;
  CURLU *u_local;
  
  pCStack_38 = (CURLU *)0x0;
  nalloc._7_1_ = (flags & 0x80) != 0;
  nalloc._6_1_ = 0;
  nalloc._5_1_ = 0;
  nalloc._4_1_ = 0;
  nalloc._3_1_ = 0;
  nalloc._2_1_ = 0;
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  storep._4_4_ = flags;
  pbStack_28 = (byte *)part;
  part_local._4_4_ = what;
  pCStack_18 = u;
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      u->field_0x52 = u->field_0x52 & 0xfb;
      pCStack_38 = u;
      break;
    case CURLUPART_USER:
      pCStack_38 = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      pCStack_38 = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      pCStack_38 = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      pCStack_38 = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      pCStack_38 = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      pCStack_38 = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      pCStack_38 = (CURLU *)&u->query;
      u->field_0x52 = u->field_0x52 & 0xfe;
      break;
    case CURLUPART_FRAGMENT:
      pCStack_38 = (CURLU *)&u->fragment;
      u->field_0x52 = u->field_0x52 & 0xfd;
      break;
    case CURLUPART_ZONEID:
      pCStack_38 = (CURLU *)&u->zoneid;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if ((pCStack_38 == (CURLU *)0x0) || (pCStack_38->scheme == (char *)0x0)) {
      if (pCStack_38 == (CURLU *)0x0) {
        free_urlhandle(u);
        memset(pCStack_18,0,0x58);
      }
    }
    else {
      (*Curl_cfree)(pCStack_38->scheme);
      pCStack_38->scheme = (char *)0x0;
    }
    return CURLUE_OK;
  }
  plen = strlen(part);
  if (8000000 < plen) {
    return CURLUE_MALFORMED_INPUT;
  }
  switch(part_local._4_4_) {
  case CURLUPART_URL:
    if (plen == 0) {
      return CURLUE_MALFORMED_INPUT;
    }
    sVar6 = Curl_is_absolute_url((char *)pbStack_28,(char *)0x0,0,(storep._4_4_ & 0x204) != 0);
    if ((sVar6 != 0) ||
       (CVar3 = curl_url_get(pCStack_18,CURLUPART_URL,&redired_url,storep._4_4_), CVar3 != CURLUE_OK
       )) {
      CVar3 = parseurl_and_replace((char *)pbStack_28,pCStack_18,storep._4_4_);
      return CVar3;
    }
    oldurl._4_4_ = concat_url(redired_url,(char *)pbStack_28,&newp);
    (*Curl_cfree)(redired_url);
    if (oldurl._4_4_ == CURLE_OK) {
      oldurl._0_4_ = parseurl_and_replace(newp,pCStack_18,storep._4_4_);
      (*Curl_cfree)(newp);
      return (CURLUcode)oldurl;
    }
    if (oldurl._4_4_ != CURLE_TOO_LARGE) {
      return CURLUE_OUT_OF_MEMORY;
    }
    return CURLUE_TOO_LARGE;
  case CURLUPART_SCHEME:
    s = (char *)strlen((char *)pbStack_28);
    tmp = (char *)pbStack_28;
    if (((char *)0x28 < s) || (s == (char *)0x0)) {
      return CURLUE_BAD_SCHEME;
    }
    if (((storep._4_4_ & 8) == 0) &&
       (pCVar4 = Curl_get_scheme_handler((char *)pbStack_28), pCVar4 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    pCStack_38 = pCStack_18;
    nalloc._7_1_ = 0;
    if (((*tmp < 'a') || ('z' < *tmp)) && ((*tmp < 'A' || ('Z' < *tmp)))) {
      return CURLUE_BAD_SCHEME;
    }
    while (s = s + -1, s != (char *)0x0) {
      if (((*tmp < '0') || ('9' < *tmp)) &&
         (((*tmp < 'a' || ('z' < *tmp)) &&
          ((((*tmp < 'A' || ('Z' < *tmp)) && (*tmp != '+')) && ((*tmp != '-' && (*tmp != '.'))))))))
      {
        return CURLUE_BAD_SCHEME;
      }
      tmp = tmp + 1;
    }
    pCStack_18->field_0x52 = pCStack_18->field_0x52 & 0xfb;
    s = (char *)0x0;
    break;
  case CURLUPART_USER:
    pCStack_38 = (CURLU *)&pCStack_18->user;
    break;
  case CURLUPART_PASSWORD:
    pCStack_38 = (CURLU *)&pCStack_18->password;
    break;
  case CURLUPART_OPTIONS:
    pCStack_38 = (CURLU *)&pCStack_18->options;
    break;
  case CURLUPART_HOST:
    pCStack_38 = (CURLU *)&pCStack_18->host;
    (*Curl_cfree)(pCStack_18->zoneid);
    pCStack_18->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    if (((char)*pbStack_28 < '0') || ('9' < (char)*pbStack_28)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    piVar5 = __errno_location();
    *piVar5 = 0;
    _uc = strtoul((char *)pbStack_28,(char **)&port,10);
    piVar5 = __errno_location();
    if (((*piVar5 == 0) && (_uc < 0x10000)) && (*(char *)port == '\0')) {
      endp = (*Curl_cstrdup)((char *)pbStack_28);
      if (endp == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      (*Curl_cfree)(pCStack_18->port);
      pCStack_18->port = endp;
      pCStack_18->portnum = (unsigned_short)_uc;
      return CURLUE_OK;
    }
    return CURLUE_BAD_PORT_NUMBER;
  case CURLUPART_PATH:
    nalloc._5_1_ = 1;
    nalloc._4_1_ = 1;
    pCStack_38 = (CURLU *)&pCStack_18->path;
    break;
  case CURLUPART_QUERY:
    nalloc._6_1_ = nalloc._7_1_ & 1;
    nalloc._2_1_ = (storep._4_4_ & 0x100) != 0;
    pCStack_38 = (CURLU *)&pCStack_18->query;
    pCStack_18->field_0x52 = pCStack_18->field_0x52 & 0xfe | 1;
    nalloc._3_1_ = nalloc._2_1_;
    break;
  case CURLUPART_FRAGMENT:
    pCStack_38 = (CURLU *)&pCStack_18->fragment;
    pCStack_18->field_0x52 = pCStack_18->field_0x52 & 0xfd | 2;
    break;
  case CURLUPART_ZONEID:
    pCStack_38 = (CURLU *)&pCStack_18->zoneid;
    break;
  default:
    return CURLUE_UNKNOWN_PART;
  }
  Curl_dyn_init((dynbuf *)local_b0,plen * 3 + 1 + (ulong)(nalloc._4_1_ & 1));
  if ((((nalloc._4_1_ & 1) == 0) || (*pbStack_28 == 0x2f)) ||
     (CVar2 = Curl_dyn_addn((dynbuf *)local_b0,"/",1), CVar2 == CURLE_OK)) {
    if ((nalloc._7_1_ & 1) == 0) {
      CVar2 = Curl_dyn_add((dynbuf *)local_b0,(char *)pbStack_28);
      if (CVar2 != CURLE_OK) {
        if (CVar2 != CURLE_TOO_LARGE) {
          return CURLUE_OUT_OF_MEMORY;
        }
        return CURLUE_TOO_LARGE;
      }
      pcStack_d0 = Curl_dyn_ptr((dynbuf *)local_b0);
      while (*pcStack_d0 != '\0') {
        if (((*pcStack_d0 == '%') &&
            (((('/' < pcStack_d0[1] && (pcStack_d0[1] < ':')) ||
              ((('`' < pcStack_d0[1] && (pcStack_d0[1] < 'g')) ||
               (('@' < pcStack_d0[1] && (pcStack_d0[1] < 'G')))))) &&
             ((('/' < pcStack_d0[2] && (pcStack_d0[2] < ':')) ||
              ((('`' < pcStack_d0[2] && (pcStack_d0[2] < 'g')) ||
               (('@' < pcStack_d0[2] && (pcStack_d0[2] < 'G')))))))))) &&
           ((('@' < pcStack_d0[1] && (pcStack_d0[1] < '[')) ||
            (('@' < pcStack_d0[2] && (pcStack_d0[2] < '[')))))) {
          cVar1 = Curl_raw_tolower(pcStack_d0[1]);
          pcStack_d0[1] = cVar1;
          cVar1 = Curl_raw_tolower(pcStack_d0[2]);
          pcStack_d0[2] = cVar1;
          pcStack_d0 = pcStack_d0 + 3;
        }
        else {
          pcStack_d0 = pcStack_d0 + 1;
        }
      }
    }
    else {
      for (pbStack_c0 = pbStack_28; *pbStack_c0 != 0; pbStack_c0 = pbStack_c0 + 1) {
        if ((*pbStack_c0 == 0x20) && ((nalloc._6_1_ & 1) != 0)) {
          CVar2 = Curl_dyn_addn((dynbuf *)local_b0,"+",1);
          if (CVar2 != CURLE_OK) {
            return CURLUE_OUT_OF_MEMORY;
          }
        }
        else if ((((*pbStack_c0 < 0x30) || (0x39 < *pbStack_c0)) &&
                 (((*pbStack_c0 < 0x61 || (0x7a < *pbStack_c0)) &&
                  ((*pbStack_c0 < 0x41 || (0x5a < *pbStack_c0)))))) &&
                (((((*pbStack_c0 != 0x2d && (*pbStack_c0 != 0x2e)) && (*pbStack_c0 != 0x5f)) &&
                  ((*pbStack_c0 != 0x7e && ((*pbStack_c0 != 0x2f || ((nalloc._5_1_ & 1) == 0))))))
                 && ((*pbStack_c0 != 0x3d || ((nalloc._2_1_ & 1) == 0)))))) {
          p._1_2_ = CONCAT11("0123456789abcdef"[(int)(uint)*pbStack_c0 >> 4],0x25);
          p._3_1_ = "0123456789abcdef"[(int)(*pbStack_c0 & 0xf)];
          CVar2 = Curl_dyn_addn((dynbuf *)local_b0,(void *)((long)&p + 1),3);
          if (CVar2 != CURLE_OK) {
            if (CVar2 != CURLE_TOO_LARGE) {
              return CURLUE_OUT_OF_MEMORY;
            }
            return CURLUE_TOO_LARGE;
          }
        }
        else {
          if ((*pbStack_c0 == 0x3d) && ((nalloc._2_1_ & 1) != 0)) {
            nalloc._2_1_ = 0;
          }
          CVar2 = Curl_dyn_addn((dynbuf *)local_b0,pbStack_c0,1);
          if (CVar2 != CURLE_OK) {
            if (CVar2 != CURLE_TOO_LARGE) {
              return CURLUE_OUT_OF_MEMORY;
            }
            return CURLUE_TOO_LARGE;
          }
        }
        p._4_4_ = 0;
      }
    }
    enc.toobig = (size_t)Curl_dyn_ptr((dynbuf *)local_b0);
    if (((nalloc._3_1_ & 1) == 0) || ((char *)enc.toobig == (char *)0x0)) {
      if ((part_local._4_4_ == CURLUPART_HOST) &&
         ((sStack_110 = Curl_dyn_len((dynbuf *)local_b0), sStack_110 != 0 ||
          ((storep._4_4_ & 0x400) == 0)))) {
        dlen._7_1_ = 0;
        if (sStack_110 == 0) {
          dlen._7_1_ = 1;
        }
        else if ((nalloc._7_1_ & 1) == 0) {
          pcStack_128 = (char *)0x0;
          CVar2 = Curl_urldecode((char *)enc.toobig,sStack_110,&stack0xfffffffffffffed8,
                                 (size_t *)&decoded,REJECT_CTRL);
          if ((CVar2 != CURLE_OK) ||
             (CVar3 = hostname_check(pCStack_18,pcStack_128,(size_t)decoded), CVar3 != CURLUE_OK)) {
            dlen._7_1_ = 1;
          }
          (*Curl_cfree)(pcStack_128);
        }
        else {
          CVar3 = hostname_check(pCStack_18,(char *)enc.toobig,sStack_110);
          if (CVar3 != CURLUE_OK) {
            dlen._7_1_ = 1;
          }
        }
        if ((dlen._7_1_ & 1) != 0) {
          Curl_dyn_free((dynbuf *)local_b0);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }
    else {
      if (pCStack_18->query == (char *)0x0) {
        local_148 = 0;
      }
      else {
        local_148 = strlen(pCStack_18->query);
      }
      local_149 = false;
      if (local_148 != 0) {
        local_149 = pCStack_18->query[local_148 - 1] != '&';
      }
      qbuf.toobig._7_1_ = local_149;
      if (local_148 != 0) {
        Curl_dyn_init((dynbuf *)&n,8000000);
        CVar2 = Curl_dyn_addn((dynbuf *)&n,pCStack_18->query,local_148);
        if ((CVar2 == CURLE_OK) &&
           ((((qbuf.toobig._7_1_ & 1) == 0 ||
             (CVar2 = Curl_dyn_addn((dynbuf *)&n,"&",1), CVar2 == CURLE_OK)) &&
            (CVar2 = Curl_dyn_add((dynbuf *)&n,(char *)enc.toobig), CVar2 == CURLE_OK)))) {
          Curl_dyn_free((dynbuf *)local_b0);
          (*Curl_cfree)(pCStack_38->scheme);
          pcVar7 = Curl_dyn_ptr((dynbuf *)&n);
          pCStack_38->scheme = pcVar7;
          return CURLUE_OK;
        }
        Curl_dyn_free((dynbuf *)local_b0);
        return CURLUE_OUT_OF_MEMORY;
      }
    }
    (*Curl_cfree)(pCStack_38->scheme);
    pCStack_38->scheme = (char *)enc.toobig;
    u_local._4_4_ = CURLUE_OK;
  }
  else {
    u_local._4_4_ = CURLUE_OUT_OF_MEMORY;
    if (CVar2 == CURLE_TOO_LARGE) {
      u_local._4_4_ = CURLUE_TOO_LARGE;
    }
  }
  return u_local._4_4_;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  bool urlencode = (flags & CURLU_URLENCODE) ? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool leadingslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;
  size_t nalloc;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      u->guessed_scheme = FALSE;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      u->query_present = FALSE;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      u->fragment_present = FALSE;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  nalloc = strlen(part);
  if(nalloc > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  switch(what) {
  case CURLUPART_SCHEME: {
    size_t plen = strlen(part);
    const char *s = part;
    if((plen > MAX_SCHEME_LEN) || (plen < 1))
      /* too long or too short */
      return CURLUE_BAD_SCHEME;
   /* verify that it is a fine scheme */
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) && !Curl_get_scheme_handler(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    if(ISALPHA(*s)) {
      /* ALPHA *( ALPHA / DIGIT / "+" / "-" / "." ) */
      while(--plen) {
        if(ISALNUM(*s) || (*s == '+') || (*s == '-') || (*s == '.'))
          s++; /* fine */
        else
          return CURLUE_BAD_SCHEME;
      }
    }
    else
      return CURLUE_BAD_SCHEME;
    u->guessed_scheme = FALSE;
    break;
  }
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
    if(!ISDIGIT(part[0]))
      /* not a number */
      return CURLUE_BAD_PORT_NUMBER;
    else {
      char *tmp;
      char *endp;
      unsigned long port;
      errno = 0;
      port = strtoul(part, &endp, 10);  /* must be decimal */
      if(errno || (port > 0xffff) || *endp)
        /* weirdly provided number, not good! */
        return CURLUE_BAD_PORT_NUMBER;
      tmp = strdup(part);
      if(!tmp)
        return CURLUE_OUT_OF_MEMORY;
      free(u->port);
      u->port = tmp;
      u->portnum = (unsigned short)port;
      return CURLUE_OK;
    }
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    leadingslash = TRUE; /* enforce */
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY) ? 1 : 0;
    equalsencode = appendquery;
    storep = &u->query;
    u->query_present = TRUE;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    u->fragment_present = TRUE;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLcode result;
    CURLUcode uc;
    char *oldurl;
    char *redired_url;

    if(!nalloc)
      /* a blank URL is not a valid URL */
      return CURLUE_MALFORMED_INPUT;

    /* if the new thing is absolute or the old one is not
     * (we could not get an absolute URL in 'oldurl'),
     * then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|
                                     CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }

    /* apply the relative part to create a new URL
     * and replace the existing one with it. */
    result = concat_url(oldurl, part, &redired_url);
    free(oldurl);
    if(result)
      return cc2cu(result);

    uc = parseurl_and_replace(redired_url, u, flags);
    free(redired_url);
    return uc;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp;
    struct dynbuf enc;
    Curl_dyn_init(&enc, nalloc * 3 + 1 + leadingslash);

    if(leadingslash && (part[0] != '/')) {
      CURLcode result = Curl_dyn_addn(&enc, "/", 1);
      if(result)
        return cc2cu(result);
    }
    if(urlencode) {
      const unsigned char *i;

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(ISUNRESERVED(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return cc2cu(result);
        }
        else {
          char out[3]={'%'};
          out[1] = hexdigits[*i >> 4];
          out[2] = hexdigits[*i & 0xf];
          result = Curl_dyn_addn(&enc, out, 3);
          if(result)
            return cc2cu(result);
        }
      }
    }
    else {
      char *p;
      CURLcode result = Curl_dyn_add(&enc, part);
      if(result)
        return cc2cu(result);
      p = Curl_dyn_ptr(&enc);
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }
    newp = Curl_dyn_ptr(&enc);

    if(appendquery && newp) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf qbuf;
        Curl_dyn_init(&qbuf, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&qbuf, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&qbuf, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&qbuf, newp))
          goto nomem;
        Curl_dyn_free(&enc);
        free(*storep);
        *storep = Curl_dyn_ptr(&qbuf);
        return CURLUE_OK;
nomem:
        Curl_dyn_free(&enc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    else if(what == CURLUPART_HOST) {
      size_t n = Curl_dyn_len(&enc);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it is allowed to be empty. */
      }
      else {
        bool bad = FALSE;
        if(!n)
          bad = TRUE; /* empty hostname is not okay */
        else if(!urlencode) {
          /* if the host name part was not URL encoded here, it was set ready
             URL encoded so we need to decode it to check */
          size_t dlen;
          char *decoded = NULL;
          CURLcode result =
            Curl_urldecode(newp, n, &decoded, &dlen, REJECT_CTRL);
          if(result || hostname_check(u, decoded, dlen))
            bad = TRUE;
          free(decoded);
        }
        else if(hostname_check(u, (char *)newp, n))
          bad = TRUE;
        if(bad) {
          Curl_dyn_free(&enc);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  return CURLUE_OK;
}